

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O1

void __thiscall
CVmObjStrCompMapReaderStream::read_mapping
          (CVmObjStrCompMapReaderStream *this,wchar_t *ref_ch,unsigned_long *uc_result_flags,
          unsigned_long *lc_result_flags,wchar_t *val_buf,size_t *value_ch_cnt)

{
  wchar_t wVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = *value_ch_cnt;
  wVar1 = (*this->str_->_vptr_CVmStream[6])();
  *ref_ch = wVar1;
  uVar2 = (*this->str_->_vptr_CVmStream[3])();
  uVar4 = (ulong)(uVar2 & 0xff);
  *value_ch_cnt = uVar4;
  iVar3 = (*this->str_->_vptr_CVmStream[8])();
  *uc_result_flags = CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->str_->_vptr_CVmStream[8])();
  *lc_result_flags = CONCAT44(extraout_var_00,iVar3);
  if (uVar5 < uVar4) {
    uVar4 = uVar5;
  }
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    do {
      wVar1 = (*this->str_->_vptr_CVmStream[6])();
      val_buf[uVar5] = wVar1;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  for (; uVar4 < *value_ch_cnt; uVar4 = uVar4 + 1) {
    (*this->str_->_vptr_CVmStream[6])();
  }
  return;
}

Assistant:

virtual void read_mapping(VMG_ wchar_t *ref_ch,
                              unsigned long *uc_result_flags,
                              unsigned long *lc_result_flags,
                              wchar_t *val_buf, size_t *value_ch_cnt)
    {
        size_t copy_limit;
        size_t copy_size;
        size_t i;

        /* limit our value character copying to the actual buffer size */
        copy_limit = *value_ch_cnt;
        
        /* read the header values */
        *ref_ch = (wchar_t)str_->read_uint2();
        copy_size = *value_ch_cnt = str_->read_byte();
        *uc_result_flags = str_->read_uint4();
        *lc_result_flags = str_->read_uint4();

        /* limit copying to the actual buffer size */
        if (copy_size > copy_limit)
            copy_size = copy_limit;

        /* read the values */
        for (i = 0 ; i < copy_size ; ++i)
            *val_buf++ = (wchar_t)str_->read_uint2();

        /* skip any values from the input that we weren't able to store */
        for ( ; i < *value_ch_cnt ; ++i)
            str_->read_uint2();
    }